

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O3

int32 __thiscall
rw::PluginList::registerStream
          (PluginList *this,uint32 id,StreamRead read,StreamWrite write,StreamGetSize getSize)

{
  LLLink *pLVar1;
  
  pLVar1 = &(this->plugins).link;
  do {
    pLVar1 = ((LLLink *)&pLVar1->next)->next;
    if (pLVar1 == &(this->plugins).link) {
      return -1;
    }
  } while (*(uint32 *)&pLVar1[-5].next != id);
  pLVar1[-3].next = (LLLink *)read;
  pLVar1[-3].prev = (LLLink *)write;
  pLVar1[-2].next = (LLLink *)getSize;
  return *(int32 *)&pLVar1[-6].prev;
}

Assistant:

int32
PluginList::registerStream(uint32 id,
	StreamRead read, StreamWrite write, StreamGetSize getSize)
{
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->id == id){
			p->read = read;
			p->write = write;
			p->getSize = getSize;
			return p->offset;
		}
	}
	return -1;
}